

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O1

void NES_DMC_np_Reset(void *chip)

{
  uint uVar1;
  ulong uVar2;
  NES_DMC *dmc;
  int iVar3;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  *(undefined4 *)((long)chip + 0x40028) = 0;
  InitializeTNDTable((NES_DMC *)chip,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),in_XMM1_Qa,in_XMM2_Qa);
  *(undefined8 *)((long)chip + 0x400a8) = 0;
  *(undefined8 *)((long)chip + 0x400b0) = 0;
  *(undefined8 *)((long)chip + 0x400b8) = 0x1ac00000004;
  *(undefined8 *)((long)chip + 0x400e4) = 0;
  *(undefined8 *)((long)chip + 0x400f0) = 0;
  *(undefined4 *)((long)chip + 0x400c4) = 0;
  *(undefined2 *)((long)chip + 0x40110) = 0;
  *(undefined4 *)((long)chip + 0x40100) = 0;
  *(undefined8 *)((long)chip + 0x40108) = 0x400000000;
  iVar3 = -0x10;
  do {
    NES_DMC_np_Write(chip,(short)iVar3 + 0x4018,'\0');
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  *(undefined2 *)((long)chip + 0x400a4) = 0;
  *(undefined2 *)((long)chip + 0x400ec) = 0;
  *(undefined8 *)((long)chip + 0x400f0) = 0;
  *(undefined1 *)((long)chip + 0x400ee) = 0;
  *(undefined1 *)((long)chip + 0x40051) = 0;
  if (*(int *)((long)chip + 0x40008) != 0) {
    *(undefined2 *)((long)chip + 0x400ec) = 0x101;
    *(undefined1 *)((long)chip + 0x400a5) = 0;
    *(undefined1 *)((long)chip + 0x400ee) = 0;
    *(undefined1 *)((long)chip + 0x40051) = 0xf;
  }
  *(undefined8 *)((long)chip + 0x40068) = 0;
  *(undefined8 *)((long)chip + 0x40070) = 0;
  *(undefined4 *)((long)chip + 0x400c0) = 0;
  *(undefined2 *)((long)chip + 0x40080) = 0;
  *(undefined1 *)((long)chip + 0x40088) = 0;
  *(undefined8 *)((long)chip + 0x4008c) = 0;
  *(undefined4 *)((long)chip + 0x40084) = 0;
  *(undefined1 *)((long)chip + 0x400a5) = 0;
  *(undefined8 *)((long)chip + 0x40078) = 0x10000000000;
  *(undefined8 *)((long)chip + 0x40054) = 0;
  *(undefined8 *)((long)chip + 0x400d4) = 0x200000001;
  if (*(int *)((long)chip + 0x4001c) != 0) {
    uVar1 = rand();
    *(uint *)((long)chip + 0x400d4) = *(uint *)((long)chip + 0x400d4) | uVar1;
  }
  uVar2 = 0xac44;
  if (*(uint *)((long)chip + 0x40098) != 0) {
    uVar2 = (ulong)*(uint *)((long)chip + 0x40098);
  }
  *(int *)((long)chip + 0x40098) = (int)uVar2;
  *(ulong *)((long)chip + 0x40118) =
       (uVar2 >> 1 | (ulong)*(uint *)((long)chip + 0x40094) << 0x20) / uVar2;
  *(undefined8 *)((long)chip + 0x40120) = 0;
  return;
}

Assistant:

void NES_DMC_np_Reset(void* chip)
{
	NES_DMC* dmc = (NES_DMC*)chip;
	int i;
	dmc->mask = 0;

	InitializeTNDTable(dmc,8227,12241,22638);

	dmc->counter[0] = 0;
	dmc->counter[1] = 0;
	dmc->counter[2] = 0;
	dmc->tphase = 0;
	dmc->nfreq = wavlen_table[0][0];
	dmc->dfreq = freq_table[0][0];

	dmc->envelope_div = 0;
	dmc->length_counter[0] = 0;
	dmc->length_counter[1] = 0;
	dmc->linear_counter = 0;
	dmc->envelope_counter = 0;

	dmc->frame_irq = false;
	dmc->frame_irq_enable = false;
	dmc->frame_sequence_count = 0;
	dmc->frame_sequence_steps = 4;
	dmc->frame_sequence_step = 0;

	for (i = 0; i < 0x10; i++)
		NES_DMC_np_Write(dmc, 0x4008 + i, 0);

	dmc->irq = false;
	NES_DMC_np_Write(dmc, 0x4015, 0x00);
	if (dmc->option[OPT_UNMUTE_ON_RESET])
		NES_DMC_np_Write(dmc, 0x4015, 0x0f);

	dmc->out[0] = dmc->out[1] = dmc->out[2] = 0;
	dmc->tri_freq = 0;
	dmc->damp = 0;
	dmc->dmc_pop = false;
	dmc->dmc_pop_offset = 0;
	dmc->dmc_pop_follow = 0;
	dmc->dac_lsb = 0;
	dmc->data = 0x100;
	dmc->adr_reg = 0;
	dmc->active = false;
	dmc->length = 0;
	dmc->len_reg = 0;
	dmc->daddress = 0;
	dmc->noise = 1;
	dmc->noise_tap = (1<<1);
	if (dmc->option[OPT_RANDOMIZE_NOISE])
	{
		dmc->noise |= rand();
	}

	NES_DMC_np_SetRate(dmc, dmc->rate);
	RC_RESET(&dmc->tick_count);
}